

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignVarCommand.cpp
# Opt level: O2

double __thiscall AssignVarCommand::execute(AssignVarCommand *this)

{
  MathInterpreter *this_00;
  Variable *this_01;
  DataBase *this_02;
  bool bVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *this_03;
  iterator iVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *pmVar3;
  mapped_type *ppVVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  undefined1 local_60 [8];
  string var_name;
  
  local_60 = (undefined1  [8])&var_name._M_string_length;
  var_name._M_dataplus._M_p = (pointer)0x0;
  var_name._M_string_length._0_1_ = 0;
  this_00 = this->i;
  std::__cxx11::string::string
            ((string *)&local_120,
             (string *)
             (this->param_v).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  MathInterpreter::insertVariables(this_00,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::find
            ((char *)(this->param_v).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,0x10eac3);
  std::__cxx11::string::substr
            ((ulong)((long)&var_name.field_2 + 8),
             (ulong)(this->param_v).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::operator=((string *)local_60,(string *)(var_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(var_name.field_2._M_local_buf + 8));
  this_03 = &DataBase::getInVarMap_abi_cxx11_(d)->_M_t;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
          ::find(this_03,(key_type *)local_60);
  pmVar3 = DataBase::getInVarMap_abi_cxx11_(d);
  if ((_Rb_tree_header *)iVar2._M_node != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header) {
    pmVar3 = DataBase::getInVarMap_abi_cxx11_(d);
    ppVVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
              ::at(pmVar3,(key_type *)local_60);
    this_01 = *ppVVar4;
    Variable::getBindSimbol_abi_cxx11_((string *)((long)&var_name.field_2 + 8),this_01);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (var_name.field_2._M_local_buf + 8),"->");
    std::__cxx11::string::~string((string *)(var_name.field_2._M_local_buf + 8));
    this_02 = d;
    if (bVar1) {
      Variable::getSim_abi_cxx11_(&local_a0,this_01);
      std::operator+(&local_c0,"set ",&local_a0);
      std::operator+(&local_e0,&local_c0," ");
      (**(this_01->super_Expression)._vptr_Expression)(this_01);
      std::__cxx11::to_string(&local_80,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&var_name.field_2 + 8),&local_e0,&local_80);
      std::operator+(&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&var_name.field_2 + 8),"\r\n");
      DataBase::addToUpdateSimQueue(this_02,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)(var_name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  std::__cxx11::string::~string((string *)local_60);
  return 0.0;
}

Assistant:

double AssignVarCommand::execute() {
  string var_name;
  int p;
  //assing in data
  this->i->insertVariables((this->param_v)[0]);
  //assign in simulator
  p = this->param_v[0].find("=");
  var_name = param_v[0].substr(0, p);
  if (!(d->getInVarMap()->find(var_name) == d->getInVarMap()->end())) {
    Variable *temp = d->getInVarMap()->at(var_name);
    // send instruction to simulator
    if (temp->getBindSimbol() == "->") {
      d->addToUpdateSimQueue(
          "set " + temp->getSim() + " " + to_string(temp->calculate())
              + "\r\n");
    }
  }
  return 0;
}